

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_2dPoint * __thiscall ON_2dPoint::operator=(ON_2dPoint *this,double *p)

{
  double dVar1;
  
  if (p == (double *)0x0) {
    this->x = 0.0;
    dVar1 = 0.0;
  }
  else {
    this->x = *p;
    dVar1 = p[1];
  }
  this->y = dVar1;
  return this;
}

Assistant:

ON_2dPoint& ON_2dPoint::operator=(const double* p)
{
  if ( p ) {
    x = p[0];
    y = p[1];
  }
  else {
    x = y = 0.0;
  }
  return *this;
}